

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix4 * matrix4_projection_ortho3d_rh_EXP
                    (matrix4 *self,double xmin,double xmax,double ymin,double ymax,double zNear,
                    double zFar)

{
  (self->field_0).m[0] = 0.0;
  (self->field_0).m[1] = 0.0;
  (self->field_0).m[4] = 0.0;
  (self->field_0).m[5] = 0.0;
  (self->field_0).m[10] = 0.0;
  (self->field_0).m[0xb] = 0.0;
  (self->field_0).m[0xe] = 0.0;
  (self->field_0).m[0xf] = 0.0;
  (self->field_0).m[0xc] = 0.0;
  (self->field_0).m[0xd] = 0.0;
  (self->field_0).m[8] = 0.0;
  (self->field_0).m[9] = 0.0;
  (self->field_0).m[6] = 0.0;
  (self->field_0).m[7] = 0.0;
  (self->field_0).m[2] = 0.0;
  (self->field_0).m[3] = 0.0;
  (self->field_0).m[0] = 2.0 / (xmax - xmin);
  (self->field_0).m[5] = 2.0 / (ymax - ymin);
  (self->field_0).m[10] = 1.0 / (zFar - zNear);
  (self->field_0).m[0xe] = zNear / (zNear - zFar);
  (self->field_0).m[0xf] = 1.0;
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_projection_ortho3d_rh_EXP(struct matrix4 *self,
							 HYP_FLOAT xmin, HYP_FLOAT xmax,
							 HYP_FLOAT ymin, HYP_FLOAT ymax,
							 HYP_FLOAT zNear, HYP_FLOAT zFar)
{
	HYP_FLOAT width;
	HYP_FLOAT height;

	matrix4_zero(self);

	width = xmax - xmin;
	height = ymax - ymin;

	self->c00 = 2.0f / width;
	self->c11 = 2.0f / height;
	self->c22 = 1.0f / (zFar - zNear);
	self->c23 = zNear / (zNear - zFar);
	self->c33 = 1.0f;

	return self;
}